

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::Box<3L>_> __thiscall
anurbs::Model::add<anurbs::Box<3l>>(Model *this,Pointer<anurbs::Box<3L>_> *data)

{
  bool bVar1;
  invalid_argument *this_00;
  size_type sVar2;
  shared_ptr<anurbs::Box<3L>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Box<3L>_> RVar3;
  shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_> local_80;
  value_type_conflict1 local_70;
  shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_> local_68;
  shared_ptr<anurbs::Box<3L>_> local_58;
  unique_ptr<anurbs::Entry<anurbs::Box<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Box<3L>_>_>_>
  local_48;
  undefined1 local_40 [8];
  Pointer<Entry<Box<3L>_>_> entry;
  Pointer<anurbs::Box<3L>_> *data_local;
  Model *this_local;
  
  bVar1 = std::operator==(in_RDX,(nullptr_t)0x0);
  if (!bVar1) {
    std::shared_ptr<anurbs::Box<3L>_>::shared_ptr(&local_58,in_RDX);
    Entry<anurbs::Box<3L>_>::create((Entry<anurbs::Box<3L>_> *)&local_48,&local_58);
    std::shared_ptr<anurbs::Entry<anurbs::Box<3l>>>::
    shared_ptr<anurbs::Entry<anurbs::Box<3l>>,std::default_delete<anurbs::Entry<anurbs::Box<3l>>>,void>
              ((shared_ptr<anurbs::Entry<anurbs::Box<3l>>> *)local_40,&local_48);
    std::
    unique_ptr<anurbs::Entry<anurbs::Box<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Box<3L>_>_>_>
    ::~unique_ptr(&local_48);
    std::shared_ptr<anurbs::Box<3L>_>::~shared_ptr(&local_58);
    std::static_pointer_cast<anurbs::EntryBase,anurbs::Entry<anurbs::Box<3l>>>(&local_68);
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ::push_back((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                 *)data,(value_type *)&local_68);
    std::shared_ptr<anurbs::EntryBase>::~shared_ptr((shared_ptr<anurbs::EntryBase> *)&local_68);
    sVar2 = std::
            vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
            ::size((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                    *)data);
    local_70 = sVar2 - 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &data[1].super___shared_ptr<anurbs::Box<3L>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_70);
    std::shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_>::shared_ptr
              (&local_80,(shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_> *)local_40);
    Ref<anurbs::Box<3L>_>::Ref((Ref<anurbs::Box<3L>_> *)this,&local_80);
    std::shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_>::~shared_ptr(&local_80);
    std::shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_>::~shared_ptr
              ((shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_> *)local_40);
    RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Ref<anurbs::Box<3L>_>)
           RVar3.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Data is null");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Ref<TData> add(Pointer<TData> data)
    {
        if (data == nullptr) {
            throw std::invalid_argument("Data is null");
        }

        Pointer<Entry<TData>> entry = Entry<TData>::create(data);

        m_entries.push_back(std::static_pointer_cast<EntryBase>(entry));

        m_entry_map.push_back(m_entries.size() - 1);

        return Ref<TData>(entry);
    }